

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

primitive_feature_space * VW::export_example(vw *all,example *ec,size_t *len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  byte *pbVar6;
  ulong uVar7;
  feature *pfVar8;
  feature_value *pfVar9;
  uint64_t *puVar10;
  int __c;
  ulong *in_RDX;
  v_array<unsigned_char> *in_RSI;
  features_value_iterator *rhs;
  feature t;
  iterator *f;
  iterator __end2;
  iterator __begin2;
  features *__range2;
  int f_count;
  uint32_t stride_shift;
  namespace_index i;
  size_t idx;
  int fs_count;
  primitive_feature_space *fs_ptr;
  parameters *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  feature_value _x;
  features *in_stack_ffffffffffffff58;
  feature local_90;
  features_value_index_iterator *local_80;
  features_value_iterator local_78 [2];
  features_value_index_iterator local_68;
  long local_58;
  int local_4c;
  uint32_t local_48;
  byte local_31;
  ulong local_30;
  int local_24;
  primitive_feature_space *local_20;
  ulong *local_18;
  v_array<unsigned_char> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar4 = v_array<unsigned_char>::size(in_RSI);
  *local_18 = sVar4;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *local_18;
  uVar5 = SUB168(auVar1 * ZEXT816(0x18),0);
  if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  local_20 = (primitive_feature_space *)operator_new__(uVar5);
  local_24 = 0;
  for (local_30 = 0; local_30 < *local_18; local_30 = local_30 + 1) {
    pbVar6 = v_array<unsigned_char>::operator[](local_10,local_30);
    local_31 = *pbVar6;
    local_20[local_24].name = local_31;
    sVar4 = features::size((features *)0x2a112c);
    local_20[local_24].len = sVar4;
    uVar5 = local_20[local_24].len;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar5;
    uVar7 = SUB168(auVar2 * ZEXT816(0x10),0);
    if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    pfVar8 = (feature *)operator_new__(uVar7);
    if (uVar5 != 0) {
      in_stack_ffffffffffffff58 = (features *)pfVar8;
      do {
        ::feature::feature((feature *)in_stack_ffffffffffffff58);
        in_stack_ffffffffffffff58 = (features *)((long)in_stack_ffffffffffffff58 + 0x10);
      } while (in_stack_ffffffffffffff58 != (features *)(pfVar8 + uVar5));
    }
    local_20[local_24].fs = pfVar8;
    local_48 = parameters::stride_shift(in_stack_ffffffffffffff38);
    local_4c = 0;
    local_58 = (long)local_10 + (ulong)local_31 * 0x68 + 0x20;
    features::begin(in_stack_ffffffffffffff58);
    features::end(in_stack_ffffffffffffff58);
    while( true ) {
      rhs = local_78;
      bVar3 = features_value_iterator::operator!=(&local_68.super_features_value_iterator,rhs);
      if (!bVar3) break;
      local_80 = features_value_index_iterator::operator*(&local_68);
      pfVar9 = features_value_iterator::value(&local_80->super_features_value_iterator);
      _x = *pfVar9;
      puVar10 = (uint64_t *)features_value_index_iterator::index(local_80,(char *)rhs,__c);
      ::feature::feature(&local_90,_x,*puVar10);
      local_90.weight_index = local_90.weight_index >> ((byte)local_48 & 0x3f);
      pfVar8 = local_20[local_24].fs + local_4c;
      pfVar8->x = local_90.x;
      *(undefined4 *)&pfVar8->field_0x4 = local_90._4_4_;
      pfVar8->weight_index = local_90.weight_index;
      local_4c = local_4c + 1;
      features_value_index_iterator::operator++
                ((features_value_index_iterator *)CONCAT44(_x,in_stack_ffffffffffffff40));
    }
    local_24 = local_24 + 1;
  }
  return local_20;
}

Assistant:

primitive_feature_space* export_example(vw& all, example* ec, size_t& len)
{
  len = ec->indices.size();
  primitive_feature_space* fs_ptr = new primitive_feature_space[len];

  int fs_count = 0;

  for (size_t idx = 0; idx < len; ++idx)
  {
    namespace_index i = ec->indices[idx];
    fs_ptr[fs_count].name = i;
    fs_ptr[fs_count].len = ec->feature_space[i].size();
    fs_ptr[fs_count].fs = new feature[fs_ptr[fs_count].len];

    uint32_t stride_shift = all.weights.stride_shift();
    int f_count = 0;
    for (features::iterator& f : ec->feature_space[i])
    {
      feature t = {f.value(), f.index()};
      t.weight_index >>= stride_shift;
      fs_ptr[fs_count].fs[f_count] = t;
      f_count++;
    }
    fs_count++;
  }
  return fs_ptr;
}